

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::unsimplify
          (SPxMainSM<double> *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s
          ,VectorBase<double> *r,VarStatus *rows,VarStatus *cols,bool isOptimal)

{
  Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_> *this_00;
  double dVar1;
  pointer pdVar2;
  long *plVar3;
  SPxOut *pSVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int j;
  long lVar8;
  double dVar9;
  double dVar10;
  Verbosity old_verbosity;
  
  pSVar4 = (this->super_SPxSimplifier<double>).spxout;
  if ((pSVar4 != (SPxOut *)0x0) && (2 < (int)pSVar4->m_verbosity)) {
    old_verbosity = pSVar4->m_verbosity;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = soplex::operator<<((this->super_SPxSimplifier<double>).spxout,
                                " --- unsimplifying solution and basis");
    std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
    pSVar4 = (this->super_SPxSimplifier<double>).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity);
  }
  for (lVar8 = 0;
      pdVar2 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar8 < (int)((ulong)((long)(x->val).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
      lVar8 = lVar8 + 1) {
    dVar1 = pdVar2[lVar8];
    dVar9 = epsZero(this);
    dVar10 = 0.0;
    if (dVar9 < ABS(dVar1)) {
      dVar10 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
    }
    (this->m_prim).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar8] = dVar10;
    dVar1 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    dVar9 = epsZero(this);
    dVar10 = 0.0;
    if ((dVar9 < ABS(dVar1)) &&
       (dVar10 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8], this->m_thesense == MAXIMIZE)) {
      dVar10 = -dVar10;
    }
    (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar8] = dVar10;
    (this->m_cBasisStat).data[lVar8] = cols[lVar8];
  }
  for (lVar8 = 0;
      pdVar2 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar8 < (int)((ulong)((long)(y->val).super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3);
      lVar8 = lVar8 + 1) {
    dVar1 = pdVar2[lVar8];
    dVar9 = epsZero(this);
    dVar10 = 0.0;
    if ((dVar9 < ABS(dVar1)) &&
       (dVar10 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar8], this->m_thesense == MAXIMIZE)) {
      dVar10 = -dVar10;
    }
    (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar8] = dVar10;
    dVar1 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8];
    dVar9 = epsZero(this);
    dVar10 = 0.0;
    if (dVar9 < ABS(dVar1)) {
      dVar10 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar8];
    }
    (this->m_slack).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar8] = dVar10;
    (this->m_rBasisStat).data[lVar8] = rows[lVar8];
  }
  this_00 = &this->m_hist;
  uVar7 = (ulong)((long)(this->m_hist).data.
                        super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_hist).data.
                       super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
  while (0 < (int)uVar7) {
    uVar7 = uVar7 - 1;
    (**(code **)(*(long *)(this_00->data).
                          super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7 & 0xffffffff].
                          super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x10))();
    plVar3 = (long *)(this_00->data).
                     super__Vector_base<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar7 & 0xffffffff].
                     super___shared_ptr<soplex::SPxMainSM<double>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
    (**(code **)(*plVar3 + 0x20))
              (plVar3,&this->m_prim,&this->m_dual,&this->m_slack,&this->m_redCost,
               &this->m_cBasisStat,&this->m_rBasisStat,isOptimal);
    Array<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>::reSize(this_00,(int)uVar7);
  }
  if (this->m_thesense == MAXIMIZE) {
    pdVar2 = (this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (ulong)((long)(this->m_redCost).val.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3;
    uVar6 = 0;
    uVar7 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pdVar2[uVar6] = -pdVar2[uVar6];
    }
    pdVar2 = (this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (ulong)((long)(this->m_dual).val.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2) >> 3;
    uVar6 = 0;
    uVar7 = uVar5 & 0xffffffff;
    if ((int)uVar5 < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pdVar2[uVar6] = -pdVar2[uVar6];
    }
  }
  if (0 < this->m_addedcols) {
    VectorBase<double>::reDim
              (&this->m_prim,
               (int)((ulong)((long)(this->m_prim).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_prim).val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) - this->m_addedcols,true);
    VectorBase<double>::reDim
              (&this->m_redCost,
               (int)((ulong)((long)(this->m_redCost).val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(this->m_redCost).val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) - this->m_addedcols,true);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              (&this->m_cBasisStat,(this->m_cBasisStat).thesize - this->m_addedcols);
    DataArray<int>::reSize(&this->m_cIdx,(this->m_cIdx).thesize - this->m_addedcols);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<double>::PostStep>_>_>
  ::clear(&this_00->data);
  this->m_postsolved = true;
  return;
}

Assistant:

void SPxMainSM<R>::unsimplify(const VectorBase<R>& x, const VectorBase<R>& y,
                              const VectorBase<R>& s, const VectorBase<R>& r,
                              const typename SPxSolverBase<R>::VarStatus rows[],
                              const typename SPxSolverBase<R>::VarStatus cols[], bool isOptimal)
{
   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- unsimplifying solution and basis" << std::endl;)
   assert(x.dim() <= m_prim.dim());
   assert(y.dim() <= m_dual.dim());
   assert(x.dim() == r.dim());
   assert(y.dim() == s.dim());

   // assign values of variables in reduced LP
   // NOTE: for maximization problems, we have to switch signs of dual and reduced cost values,
   // since simplifier assumes minimization problem
   for(int j = 0; j < x.dim(); ++j)
   {
      m_prim[j] = isZero(x[j], this->epsZero()) ? 0.0 : x[j];
      m_redCost[j] = isZero(r[j], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -r[j] :
                     r[j]);
      m_cBasisStat[j] = cols[j];
   }

   for(int i = 0; i < y.dim(); ++i)
   {
      m_dual[i] = isZero(y[i], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -y[i] :
                  y[i]);
      m_slack[i] = isZero(s[i], this->epsZero()) ? 0.0 : s[i];
      m_rBasisStat[i] = rows[i];
   }

   // undo preprocessing
   for(int k = m_hist.size() - 1; k >= 0; --k)
   {
      SPxOut::debug(this, "unsimplifying {} \n", m_hist[k]->getName());

      try
      {
         m_hist[k]->execute(m_prim, m_dual, m_slack, m_redCost, m_cBasisStat, m_rBasisStat, isOptimal);
      }
      catch(const SPxException& ex)
      {
         SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Exception thrown while unsimplifying " <<
                       m_hist[k]->getName() << ":\n" << ex.what() << "\n");
         throw SPxInternalCodeException("XMAISM00 Exception thrown during unsimply().");
      }

      m_hist.reSize(k);
   }

   // for maximization problems, we have to switch signs of dual and reduced cost values back
   if(m_thesense == SPxLPBase<R>::MAXIMIZE)
   {
      for(int j = 0; j < m_redCost.dim(); ++j)
         m_redCost[j] = -m_redCost[j];

      for(int i = 0; i < m_dual.dim(); ++i)
         m_dual[i] = -m_dual[i];
   }

   if(m_addedcols > 0)
   {
      assert(m_prim.dim() >= m_addedcols);
      m_prim.reDim(m_prim.dim() - m_addedcols);
      m_redCost.reDim(m_redCost.dim() - m_addedcols);
      m_cBasisStat.reSize(m_cBasisStat.size() - m_addedcols);
      m_cIdx.reSize(m_cIdx.size() - m_addedcols);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM
   int numBasis = 0;

   for(int rs = 0; rs < m_rBasisStat.size(); ++rs)
   {
      if(m_rBasisStat[rs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   for(int cs = 0; cs < m_cBasisStat.size(); ++cs)
   {
      if(m_cBasisStat[cs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   if(numBasis != m_rBasisStat.size())
   {
      throw SPxInternalCodeException("XMAISM26 Dimension doesn't match after this step.");
   }

#endif

   m_hist.clear();
   m_postsolved = true;
}